

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

int __thiscall QDockWidgetLayout::minimumTitleWidth(QDockWidgetLayout *this)

{
  char cVar1;
  QLayoutItem *pQVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QWidget *this_00;
  undefined4 extraout_var;
  ulong uVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar12;
  QStyle *pQVar13;
  undefined8 uVar14;
  int iVar15;
  long *plVar10;
  
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  pQVar2 = (this->item_list).d.ptr[3];
  if (pQVar2 != (QLayoutItem *)0x0) {
    iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
    plVar10 = (long *)CONCAT44(extraout_var,iVar4);
    if (plVar10 != (long *)0x0) {
      cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
      uVar11 = (**(code **)(*plVar10 + 0x78))(plVar10);
      uVar3 = uVar11 >> 0x20;
      if (cVar1 == '\0') {
        uVar3 = uVar11;
      }
      return (int)uVar3;
    }
  }
  uVar6 = *(uint *)(*(long *)&this_00->field_0x8 + 0x260);
  iVar4 = 0;
  if ((uVar6 & 1) == 0) {
    iVar5 = 0;
    uVar14 = 0;
  }
  else {
    pQVar2 = (this->item_list).d.ptr[1];
    iVar5 = 0;
    uVar14 = 0;
    if (pQVar2 != (QLayoutItem *)0x0) {
      iVar5 = (*pQVar2->_vptr_QLayoutItem[0xd])();
      uVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x70))
                         ((long *)CONCAT44(extraout_var_00,iVar5));
      iVar5 = (int)((ulong)uVar14 >> 0x20);
      uVar6 = *(uint *)(*(long *)&this_00->field_0x8 + 0x260);
    }
  }
  if ((uVar6 & 4) == 0) {
    iVar15 = 0;
  }
  else {
    pQVar2 = (this->item_list).d.ptr[2];
    iVar15 = 0;
    if (pQVar2 != (QLayoutItem *)0x0) {
      iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
      uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x70))
                         ((long *)CONCAT44(extraout_var_01,iVar4));
      iVar15 = (int)uVar12;
      iVar4 = (int)((ulong)uVar12 >> 0x20);
    }
  }
  iVar7 = titleHeight(this);
  pQVar13 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x46,0,this_00);
  pQVar13 = QWidget::style(this_00);
  iVar9 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x12,0,this_00);
  if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') {
    iVar4 = iVar15;
    iVar5 = (int)uVar14;
  }
  return iVar4 + iVar5 + iVar8 * 3 + iVar7 + iVar9 * 2;
}

Assistant:

int QDockWidgetLayout::minimumTitleWidth() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return pick(verticalTitleBar, title->minimumSizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (hasFeature(q, QDockWidget::DockWidgetClosable)) {
        if (QLayoutItem *item = item_list[CloseButton])
            closeSize = item->widget()->sizeHint();
    }
    if (hasFeature(q, QDockWidget::DockWidgetFloatable)) {
        if (QLayoutItem *item = item_list[FloatButton])
            floatSize = item->widget()->sizeHint();
    }

    int titleHeight = this->titleHeight();

    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);
    int fw = q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q);

    return pick(verticalTitleBar, closeSize)
            + pick(verticalTitleBar, floatSize)
            + titleHeight + 2*fw + 3*mw;
}